

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O2

void __thiscall NPC_Data::LoadShopDrop(NPC_Data *this)

{
  unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_> *this_00;
  char cVar1;
  short sVar2;
  World *pWVar3;
  pointer pbVar4;
  unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_> __p_00;
  bool bVar5;
  __type _Var6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ENF_Data *pEVar11;
  NPC_Data *pNVar12;
  NPC_Citizenship *pNVar13;
  Home *pHVar14;
  int subject;
  int subject_00;
  int subject_01;
  int extraout_EDX;
  int extraout_EDX_00;
  int subject_02;
  int subject_03;
  long lVar15;
  long lVar16;
  uint uVar17;
  pointer __p;
  ulong uVar18;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> uVar19;
  string *this_01;
  int ii;
  long lVar20;
  __node_base *p_Var21;
  double dVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  double local_e0;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> drop;
  variant local_b8;
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  *local_78;
  unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_> item_1;
  pointer local_68;
  string local_50;
  
  UnloadShopDrop(this);
  pWVar3 = this->world;
  util::to_string_abi_cxx11_((string *)&drop,(util *)(ulong)(uint)(int)this->id,subject);
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&pWVar3->drops_config,(string *)&drop);
  std::__cxx11::string::~string((string *)&drop);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00163f47:
    pWVar3 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drop,"Version",(allocator<char> *)&parts);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->shops_config,(key_type *)&drop);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&drop);
    pNVar12 = this;
    if (1 < iVar7) {
      pEVar11 = ENF(this);
      pNVar12 = (NPC_Data *)&pEVar11->vendor_id;
    }
    sVar2 = pNVar12->id;
    pEVar11 = ENF(this);
    if (0 < sVar2 && pEVar11->type == Shop) {
      uVar17 = (uint)sVar2;
      pWVar3 = this->world;
      util::to_string_abi_cxx11_((string *)&item_1,(util *)(ulong)uVar17,subject_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts,
                     (string *)&item_1,".name");
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->shops_config,(key_type *)&parts);
      util::variant::GetString_abi_cxx11_((string *)&drop,pmVar10);
      std::__cxx11::string::operator=((string *)&this->shop_name,(string *)&drop);
      std::__cxx11::string::~string((string *)&drop);
      std::__cxx11::string::~string((string *)&parts);
      std::__cxx11::string::~string((string *)&item_1);
      pWVar3 = this->world;
      util::to_string_abi_cxx11_((string *)&parts,(util *)(ulong)uVar17,subject_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drop,
                     (string *)&parts,".trade");
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pWVar3->shops_config,(key_type *)&drop);
      std::__cxx11::string::~string((string *)&drop);
      std::__cxx11::string::~string((string *)&parts);
      iVar7 = extraout_EDX;
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  ((string *)&drop,
                   (variant *)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode(&parts,',',(string *)&drop);
        std::__cxx11::string::~string((string *)&drop);
        uVar18 = (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (1 < uVar18) {
          if (uVar18 % 3 != 0) {
            Console::Wrn("skipping invalid trade shop data for vendor #%i",(ulong)uVar17);
            goto LAB_001645fc;
          }
          std::
          vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
          ::resize(&this->shop_trade,uVar18 / 3);
          lVar15 = 0x40;
          for (uVar18 = 0;
              pbVar4 = parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
              uVar18 < (ulong)((long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar18 = uVar18 + 3) {
            drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                 operator_new(0xc);
            iVar7 = util::to_int((string *)((long)&pbVar4[-2]._M_dataplus._M_p + lVar15));
            *(short *)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t
                      .super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                      super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl = (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                         _M_p + lVar15));
            *(int *)((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                           ._M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                           super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 4) = iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&((parts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar15));
            *(int *)((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                           ._M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                           super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 8) = iVar7;
            uVar19 = drop;
            if (((*(int *)((long)drop._M_t.
                                 super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                                 super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 4) < iVar7)
                && (iVar7 != 0)) &&
               (*(int *)((long)drop._M_t.
                               super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                               super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                               super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 4) != 0)) {
              Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.",
                           (ulong)*(ushort *)
                                   drop._M_t.
                                   super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>
                                   .super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl,
                           (ulong)uVar17);
              uVar19 = drop;
            }
            drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                 (__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>)0x0;
            std::__uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
            reset((__uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_> *
                  )((this->shop_trade).
                    super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar18 / 3),
                  (pointer)uVar19._M_t.
                           super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                           super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                           super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl);
            std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
            ~unique_ptr((unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                         *)&drop);
            lVar15 = lVar15 + 0x60;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
        iVar7 = extraout_EDX_00;
      }
      pWVar3 = this->world;
      util::to_string_abi_cxx11_((string *)&parts,(util *)(ulong)uVar17,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drop,
                     (string *)&parts,".craft");
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pWVar3->shops_config,(key_type *)&drop);
      std::__cxx11::string::~string((string *)&drop);
      std::__cxx11::string::~string((string *)&parts);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  ((string *)&drop,
                   (variant *)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode(&parts,',',(string *)&drop);
        std::__cxx11::string::~string((string *)&drop);
        uVar18 = (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (1 < uVar18) {
          if (uVar18 % 9 != 0) {
            Console::Wrn("skipping invalid craft shop data for vendor #%i",(ulong)uVar17);
            goto LAB_001645fc;
          }
          local_78 = &this->shop_craft;
          std::
          vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
          ::resize(local_78,uVar18 / 9);
          lVar15 = 0x20;
          for (uVar18 = 0;
              uVar18 < (ulong)((long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar18 = uVar18 + 9) {
            item_1._M_t.
            super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>.
            _M_t.
            super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
            .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>,_true,_true>
                  )operator_new(0x20);
            *(undefined8 *)
             ((long)item_1._M_t.
                    super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                    .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl + 8) = 0;
            *(undefined8 *)
             ((long)item_1._M_t.
                    super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                    .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl + 0x10) = 0;
            *(undefined8 *)
             ((long)item_1._M_t.
                    super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                    .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl + 0x18) = 0;
            drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                 (__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>)0x0;
            std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
            resize((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> *)
                   &drop,4);
            iVar7 = util::to_int(parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar18);
            *(short *)item_1._M_t.
                      super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                      .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl =
                 (short)iVar7;
            lVar16 = lVar15;
            for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
              iVar7 = util::to_int((string *)
                                   ((long)&((parts.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar16));
              iVar8 = util::to_int((string *)
                                   ((long)&parts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                           _M_p + lVar16));
              *(short *)((long)drop._M_t.
                               super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                               super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                               super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + lVar20 * 4) =
                   (short)iVar7;
              *(char *)((long)drop._M_t.
                              super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                              super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                              super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 2 + lVar20 * 4
                       ) = (char)iVar8;
              lVar16 = lVar16 + 0x40;
            }
            std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
            operator=((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                       *)((long)item_1._M_t.
                                super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl +
                         8),(vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                             *)&drop);
            __p_00 = item_1;
            item_1._M_t.
            super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>.
            _M_t.
            super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
            .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>,_true,_true>
                  )(__uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>)
                   0x0;
            std::__uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>::
            reset((__uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_> *
                  )((local_78->
                    super__Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar18 / 9),
                  (pointer)__p_00._M_t.
                           super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                           .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl);
            std::_Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
            ::~_Vector_base((_Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                             *)&drop);
            std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>::
            ~unique_ptr(&item_1);
            lVar15 = lVar15 + 0x120;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
      }
    }
    pWVar3 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drop,"Version",(allocator<char> *)&parts);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->skills_config,(key_type *)&drop);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&drop);
    pNVar12 = this;
    if (1 < iVar7) {
      pEVar11 = ENF(this);
      pNVar12 = (NPC_Data *)&pEVar11->vendor_id;
    }
    sVar2 = pNVar12->id;
    pEVar11 = ENF(this);
    if (0 < sVar2 && pEVar11->type == Skills) {
      uVar17 = (uint)sVar2;
      pWVar3 = this->world;
      util::to_string_abi_cxx11_((string *)&item_1,(util *)(ulong)uVar17,subject_02);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts,
                     (string *)&item_1,".name");
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->skills_config,(key_type *)&parts);
      util::variant::GetString_abi_cxx11_((string *)&drop,pmVar10);
      std::__cxx11::string::operator=((string *)&this->skill_name,(string *)&drop);
      std::__cxx11::string::~string((string *)&drop);
      std::__cxx11::string::~string((string *)&parts);
      std::__cxx11::string::~string((string *)&item_1);
      pWVar3 = this->world;
      util::to_string_abi_cxx11_((string *)&parts,(util *)(ulong)uVar17,subject_03);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drop,
                     (string *)&parts,".learn");
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pWVar3->skills_config,(key_type *)&drop);
      std::__cxx11::string::~string((string *)&drop);
      std::__cxx11::string::~string((string *)&parts);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  ((string *)&drop,
                   (variant *)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode(&parts,',',(string *)&drop);
        std::__cxx11::string::~string((string *)&drop);
        uVar18 = (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (1 < uVar18) {
          if (uVar18 % 0xe != 0) {
            Console::Err("WARNING: skipping invalid skill learn data for vendor #%i",(ulong)uVar17);
            goto LAB_001645fc;
          }
          std::
          vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
          ::resize(&this->skill_learn,uVar18 / 0xe);
          lVar15 = 0x1a0;
          for (uVar18 = 0;
              pbVar4 = parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
              uVar18 < (ulong)((long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar18 = uVar18 + 0xe) {
            drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                 operator_new(0x20);
            iVar7 = util::to_int((string *)((long)&pbVar4[-0xd]._M_dataplus._M_p + lVar15));
            *(short *)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t
                      .super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                      super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl = (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-0xc]._M_dataplus
                                         ._M_p + lVar15));
            *(int *)((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                           ._M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                           super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 4) = iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-0xb]._M_dataplus
                                         ._M_p + lVar15));
            *(char *)((long)drop._M_t.
                            super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 8) = (char)iVar7
            ;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-10]._M_dataplus.
                                         _M_p + lVar15));
            *(char *)((long)drop._M_t.
                            super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 9) = (char)iVar7
            ;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-9]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 10) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-8]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0xc) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-7]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0xe) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-6]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x10) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-5]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x12) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-4]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x14) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-3]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x16) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-2]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x18) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                         _M_p + lVar15));
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x1a) =
                 (short)iVar7;
            iVar7 = util::to_int((string *)
                                 ((long)&((parts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar15));
            uVar19 = drop;
            *(short *)((long)drop._M_t.
                             super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x1c) =
                 (short)iVar7;
            drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                 (__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>)0x0;
            std::__uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::reset
                      ((__uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                       ((this->skill_learn).
                        super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar18 / 0xe),
                       (pointer)uVar19._M_t.
                                super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t
                                .super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                                super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl);
            std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::~unique_ptr
                      ((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)&drop);
            lVar15 = lVar15 + 0x1c0;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
      }
    }
    pWVar3 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drop,"Version",(allocator<char> *)&parts);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->home_config,(key_type *)&drop);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&drop);
    pNVar12 = this;
    if (1 < iVar7) {
      pEVar11 = ENF(this);
      pNVar12 = (NPC_Data *)&pEVar11->vendor_id;
    }
    sVar2 = pNVar12->id;
    pEVar11 = ENF(this);
    if (0 < sVar2 && pEVar11->type == Inn) {
      local_78 = (vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                  *)CONCAT44(local_78._4_4_,(int)sVar2);
      this_00 = &this->citizenship;
LAB_001648d1:
      p_Var21 = &(this->world->home_config).
                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ._M_h._M_before_begin;
      do {
        p_Var21 = p_Var21->_M_nxt;
        if (p_Var21 == (__node_base *)0x0) {
          return;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                *)&drop,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                         *)(p_Var21 + 1));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&item_1,'.',(string *)&drop);
        if (0x20 < (ulong)((long)local_68 -
                          (long)item_1._M_t.
                                super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl))
        {
          pNVar13 = (this_00->_M_t).
                    super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                    .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
          if (pNVar13 == (NPC_Citizenship *)0x0) {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)item_1._M_t.
                                              super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                              .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                              _M_head_impl + 0x20),"innkeeper");
            if (bVar5) {
              util::variant::GetString_abi_cxx11_((string *)&parts,&local_b8);
              iVar7 = util::to_int((string *)&parts);
              std::__cxx11::string::~string((string *)&parts);
              if (iVar7 == (int)local_78) goto LAB_00164b5a;
            }
            pNVar13 = (this_00->_M_t).
                      super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                      .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
            if (pNVar13 == (NPC_Citizenship *)0x0) goto LAB_00164b40;
          }
          _Var6 = std::operator==(&pNVar13->home,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)item_1._M_t.
                                     super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                     .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                     _M_head_impl);
          if (_Var6) {
            std::__cxx11::string::substr
                      ((ulong)&parts,
                       (long)item_1._M_t.
                             super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                             .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl +
                       0x20);
            bVar5 = std::operator==((string *)&parts,"question");
            std::__cxx11::string::~string((string *)&parts);
            if (!bVar5) goto LAB_00164a52;
            cVar1 = *(char *)(*(long *)((long)item_1._M_t.
                                              super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                              .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                              _M_head_impl + 0x20) + -1 +
                             *(long *)((long)item_1._M_t.
                                             super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                             .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                             _M_head_impl + 0x28));
            if ((byte)(cVar1 - 0x34U) < 0xfd) {
              util::variant::GetString_abi_cxx11_((string *)&parts,&local_b8);
              Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i",
                           parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,(ulong)local_78 & 0xffffffff);
              std::__cxx11::string::~string((string *)&parts);
            }
            util::variant::GetString_abi_cxx11_((string *)&parts,&local_b8);
            this_01 = (string *)
                      ((long)(this_00->_M_t).
                             super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                             .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                      (long)cVar1 * 0x20 + -0x600);
LAB_00164b30:
            std::__cxx11::string::operator=(this_01,(string *)&parts);
            std::__cxx11::string::~string((string *)&parts);
          }
          else {
LAB_00164a52:
            pNVar13 = (this_00->_M_t).
                      super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                      .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
            if ((pNVar13 != (NPC_Citizenship *)0x0) &&
               (_Var6 = std::operator==(&pNVar13->home,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)item_1._M_t.
                                           super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                           .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                           _M_head_impl), _Var6)) {
              std::__cxx11::string::substr
                        ((ulong)&parts,
                         (long)item_1._M_t.
                               super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                               .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl +
                         0x20);
              bVar5 = std::operator==((string *)&parts,"answer");
              std::__cxx11::string::~string((string *)&parts);
              if (bVar5) {
                cVar1 = *(char *)(*(long *)((long)item_1._M_t.
                                                  super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                                  .
                                                  super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>
                                                  ._M_head_impl + 0x20) + -1 +
                                 *(long *)((long)item_1._M_t.
                                                 super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                                 .
                                                 super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>
                                                 ._M_head_impl + 0x28));
                if ((byte)(cVar1 - 0x34U) < 0xfd) {
                  util::variant::GetString_abi_cxx11_((string *)&parts,&local_b8);
                  Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i",
                               parts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)local_78 & 0xffffffff);
                  std::__cxx11::string::~string((string *)&parts);
                }
                util::variant::GetString_abi_cxx11_((string *)&parts,&local_b8);
                this_01 = (string *)
                          ((long)(this_00->_M_t).
                                 super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                                 .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                          (long)cVar1 * 0x20 + -0x5a0);
                goto LAB_00164b30;
              }
            }
          }
        }
LAB_00164b40:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&item_1);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                 *)&drop);
      } while( true );
    }
  }
  else {
    util::variant::GetString_abi_cxx11_
              ((string *)&drop,
               (variant *)
               ((long)iVar9.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                      ._M_cur + 0x28));
    util::explode(&parts,',',(string *)&drop);
    std::__cxx11::string::~string((string *)&drop);
    uVar18 = (long)parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar18 < 2) {
LAB_00163f3d:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
      goto LAB_00163f47;
    }
    if (((long)parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 0x60U) == 0) {
      std::
      vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
      ::resize(&this->drops,uVar18 >> 2);
      local_e0 = 0.0;
      lVar15 = 0;
      for (uVar18 = 0;
          pbVar4 = parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar18 < (ulong)((long)parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar18 = uVar18 + 4) {
        drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
        super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
        super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
             (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
             operator_new(0x20);
        iVar7 = util::to_int((string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar15));
        *(short *)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                  super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                  super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl = (short)iVar7;
        iVar7 = util::to_int((string *)
                             ((long)&parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p +
                             lVar15));
        *(int *)((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                       _M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                       super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 4) = iVar7;
        iVar7 = util::to_int((string *)
                             ((long)&parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p +
                             lVar15));
        *(int *)((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                       _M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                       super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 8) = iVar7;
        dVar22 = util::to_float((string *)
                                ((long)&parts.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus.
                                        _M_p + lVar15));
        uVar19 = drop;
        *(double *)
         ((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x10) = dVar22;
        *(double *)
         ((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 0x18) = local_e0;
        local_e0 = local_e0 + dVar22;
        drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
        super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
        super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
             (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
             (__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>)0x0;
        std::__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>::reset
                  ((__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_> *)
                   ((long)&(((this->drops).
                             super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t +
                   uVar18 * 2),
                   (pointer)uVar19._M_t.
                            super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl);
        std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::~unique_ptr(&drop);
        lVar15 = lVar15 + 0x80;
      }
      if (local_e0 <= 100.001) {
        this->drops_chance_total = 100.0;
      }
      else {
        this->drops_chance_total = local_e0;
        pWVar3 = this->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&drop,"DropRateMode",(allocator<char> *)&item_1);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar3->config,(key_type *)&drop);
        iVar7 = util::variant::GetInt(pmVar10);
        std::__cxx11::string::~string((string *)&drop);
        if (iVar7 == 3) {
          Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally."
                       ,this->drops_chance_total,(ulong)(uint)(int)this->id);
        }
      }
      goto LAB_00163f3d;
    }
    Console::Wrn("skipping invalid drop data for NPC #%i",(ulong)(uint)(int)this->id);
LAB_001645fc:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parts);
  }
  return;
LAB_00164b5a:
  pNVar13 = (NPC_Citizenship *)operator_new(0xe0);
  NPC_Citizenship::NPC_Citizenship(pNVar13);
  std::__uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::reset
            ((__uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_> *)this_00,
             pNVar13);
  std::__cxx11::string::_M_assign
            ((string *)
             (this_00->_M_t).
             super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
             super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
             super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl);
  pWVar3 = this->world;
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             (this->citizenship)._M_t.
             super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
             super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
             super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl);
  pHVar14 = World::GetHome(pWVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pHVar14 == (Home *)0x0) {
    Console::Wrn("Vendor #%i\'s innkeeper set on non-existent home: %s",(ulong)local_78 & 0xffffffff
                 ,(pointer)(((this_00->_M_t).
                             super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                             .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl)->home).
                           _M_dataplus);
  }
  else {
    pEVar11 = ENF(this);
    pHVar14->innkeeper_vend = (int)pEVar11->vendor_id;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&item_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
           *)&drop);
  goto LAB_001648d1;
}

Assistant:

void NPC_Data::LoadShopDrop()
{
	this->UnloadShopDrop();

	Config::iterator drops = this->world->drops_config.find(util::to_string(this->id));
	if (drops != this->world->drops_config.end())
	{
		std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*drops).second));

		if (parts.size() > 1)
		{
			if (parts.size() % 4 != 0)
			{
				Console::Wrn("skipping invalid drop data for NPC #%i", id);
				return;
			}

			double chance_offset = 0.0;

			this->drops.resize(parts.size() / 4);

			for (std::size_t i = 0; i < parts.size(); i += 4)
			{
				std::unique_ptr<NPC_Drop> drop(new NPC_Drop);

				drop->id = util::to_int(parts[i]);
				drop->min = util::to_int(parts[i+1]);
				drop->max = util::to_int(parts[i+2]);
				drop->chance = util::to_float(parts[i+3]);
				drop->chance_offset = chance_offset;

				chance_offset += drop->chance;

				this->drops[i/4] = std::move(drop);
			}

			if (chance_offset > 100.001)
			{
				this->drops_chance_total = chance_offset;

				if (static_cast<int>(this->world->config["DropRateMode"]) == 3)
					Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally.", this->id, this->drops_chance_total);
			}
			else
			{
				this->drops_chance_total = 100.0;
			}
		}
	}

	short shop_vend_id;

	if (int(this->world->shops_config["Version"]) < 2)
	{
		shop_vend_id = this->id;
	}
	else
	{
		shop_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Shop && shop_vend_id > 0)
	{
		this->shop_name = static_cast<std::string>(this->world->shops_config[util::to_string(shop_vend_id) + ".name"]);
		Config::iterator shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".trade");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 3 != 0)
				{
					Console::Wrn("skipping invalid trade shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_trade.resize(parts.size() / 3);

				for (std::size_t i = 0; i < parts.size(); i += 3)
				{
					std::unique_ptr<NPC_Shop_Trade_Item> item(new NPC_Shop_Trade_Item);
					item->id = util::to_int(parts[i]);
					item->buy = util::to_int(parts[i+1]);
					item->sell = util::to_int(parts[i+2]);

					if (item->buy != 0 && item->sell != 0 && item->sell > item->buy)
					{
						Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.", item->id, shop_vend_id);
					}

					this->shop_trade[i/3] = std::move(item);
				}
			}
		}

		shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".craft");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 9 != 0)
				{
					Console::Wrn("skipping invalid craft shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_craft.resize(parts.size() / 9);

				for (std::size_t i = 0; i < parts.size(); i += 9)
				{
					std::unique_ptr<NPC_Shop_Craft_Item> item(new NPC_Shop_Craft_Item);
					std::vector<NPC_Shop_Craft_Ingredient> ingredients;
					ingredients.resize(4);

					item->id = util::to_int(parts[i]);

					for (int ii = 0; ii < 4; ++ii)
					{
						NPC_Shop_Craft_Ingredient ingredient;
						ingredient.id = util::to_int(parts[i+1+ii*2]);
						ingredient.amount = util::to_int(parts[i+2+ii*2]);
						ingredients[ii] = ingredient;
					}

					item->ingredients = ingredients;

					this->shop_craft[i/9] = std::move(item);
				}
			}
		}
	}

	short skills_vend_id;

	if (int(this->world->skills_config["Version"]) < 2)
	{
		skills_vend_id = this->id;
	}
	else
	{
		skills_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Skills && skills_vend_id > 0)
	{
		this->skill_name = static_cast<std::string>(this->world->skills_config[util::to_string(skills_vend_id) + ".name"]);
		Config::iterator skills = this->world->skills_config.find(util::to_string(skills_vend_id) + ".learn");
		if (skills != this->world->skills_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*skills).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 14 != 0)
				{
					Console::Err("WARNING: skipping invalid skill learn data for vendor #%i", skills_vend_id);
					return;
				}

				this->skill_learn.resize(parts.size() / 14);

				for (std::size_t i = 0; i < parts.size(); i += 14)
				{
					std::unique_ptr<NPC_Learn_Skill> skill(new NPC_Learn_Skill);

					skill->id = util::to_int(parts[i]);
					skill->cost = util::to_int(parts[i+1]);
					skill->levelreq = util::to_int(parts[i+2]);
					skill->classreq = util::to_int(parts[i+3]);

					skill->skillreq[0] = util::to_int(parts[i+4]);
					skill->skillreq[1] = util::to_int(parts[i+5]);
					skill->skillreq[2] = util::to_int(parts[i+6]);
					skill->skillreq[3] = util::to_int(parts[i+7]);

					skill->strreq = util::to_int(parts[i+8]);
					skill->intreq = util::to_int(parts[i+9]);
					skill->wisreq = util::to_int(parts[i+10]);
					skill->agireq = util::to_int(parts[i+11]);
					skill->conreq = util::to_int(parts[i+12]);
					skill->chareq = util::to_int(parts[i+13]);

					this->skill_learn[i/14] = std::move(skill);
				}
			}
		}
	}

	short home_vend_id;

	if (int(this->world->home_config["Version"]) < 2)
	{
		home_vend_id = this->id;
	}
	else
	{
		home_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Inn && home_vend_id > 0)
	{
		restart_loop:
		UTIL_FOREACH(this->world->home_config, hc)
		{
			std::vector<std::string> parts = util::explode('.', hc.first);

			if (parts.size() < 2)
			{
				continue;
			}

			if (!this->citizenship && parts[1] == "innkeeper" && util::to_int(hc.second) == home_vend_id)
			{
				this->citizenship.reset(new NPC_Citizenship);
				this->citizenship->home = parts[0];
				Home* home = this->world->GetHome(this->citizenship->home);

				if (home)
					home->innkeeper_vend = this->ENF().vendor_id;
				else
					Console::Wrn("Vendor #%i's innkeeper set on non-existent home: %s", home_vend_id, this->citizenship->home.c_str());

				// Restart the loop so questions/answers specified before the innkeeper option will load
				goto restart_loop;
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "question")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->questions[index] = static_cast<std::string>(hc.second);
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "answer")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->answers[index] = static_cast<std::string>(hc.second);
			}
		}
	}
}